

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int file_register_hardlink(archive_write *a,file_conflict *file)

{
  void *pvVar1;
  char *key;
  archive_rb_node *paVar2;
  
  pvVar1 = a->format_data;
  archive_entry_set_nlink(file->entry,1);
  key = archive_entry_hardlink(file->entry);
  if (key == (char *)0x0) {
    paVar2 = (archive_rb_node *)malloc(0x30);
    if (paVar2 == (archive_rb_node *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    *(undefined4 *)paVar2[1].rb_nodes = 1;
    file->hlnext = (file_conflict *)0x0;
    paVar2[1].rb_nodes[1] = &file->rbnode;
    paVar2[1].rb_info = (uintptr_t)&file->hlnext;
    __archive_rb_tree_insert_node((archive_rb_tree *)((long)pvVar1 + 0x101b8),paVar2);
  }
  else {
    paVar2 = __archive_rb_tree_find_node((archive_rb_tree *)((long)pvVar1 + 0x101b8),key);
    if (paVar2 != (archive_rb_node *)0x0) {
      file->hlnext = (file_conflict *)0x0;
      *(file_conflict **)paVar2[1].rb_info = file;
      paVar2[1].rb_info = (uintptr_t)&file->hlnext;
      *(int *)paVar2[1].rb_nodes = *(int *)paVar2[1].rb_nodes + 1;
    }
    archive_entry_unset_size(file->entry);
  }
  return 0;
}

Assistant:

static int
file_register_hardlink(struct archive_write *a, struct file *file)
{
	struct xar *xar = (struct xar *)a->format_data;
	struct hardlink *hl;
	const char *pathname;

	archive_entry_set_nlink(file->entry, 1);
	pathname = archive_entry_hardlink(file->entry);
	if (pathname == NULL) {
		/* This `file` is a hardlink target. */
		hl = malloc(sizeof(*hl));
		if (hl == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		hl->nlink = 1;
		/* A hardlink target must be the first position. */
		file->hlnext = NULL;
		hl->file_list.first = file;
		hl->file_list.last = &(file->hlnext);
		__archive_rb_tree_insert_node(&(xar->hardlink_rbtree),
		    (struct archive_rb_node *)hl);
	} else {
		hl = (struct hardlink *)__archive_rb_tree_find_node(
		    &(xar->hardlink_rbtree), pathname);
		if (hl != NULL) {
			/* Insert `file` entry into the tail. */
			file->hlnext = NULL;
			*hl->file_list.last = file;
			hl->file_list.last = &(file->hlnext);
			hl->nlink++;
		}
		archive_entry_unset_size(file->entry);
	}

	return (ARCHIVE_OK);
}